

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRHandler.cc
# Opt level: O0

bool __thiscall flow::IRHandler::isAfter(IRHandler *this,BasicBlock *bb,BasicBlock *afterThat)

{
  bool bVar1;
  IRHandler *pIVar2;
  pointer this_00;
  pointer pBVar3;
  _Self local_58;
  _Self local_50;
  BasicBlock **local_48;
  _List_node_base *local_40;
  _List_const_iterator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>
  local_38;
  _Self local_30;
  _List_const_iterator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_> i
  ;
  BasicBlock *afterThat_local;
  BasicBlock *bb_local;
  IRHandler *this_local;
  
  i._M_node = (_List_node_base *)afterThat;
  afterThat_local = bb;
  bb_local = (BasicBlock *)this;
  pIVar2 = BasicBlock::getHandler(bb);
  if (pIVar2 != this) {
    __assert_fail("bb->getHandler() == this",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/ir/IRHandler.cc"
                  ,0x48,
                  "bool flow::IRHandler::isAfter(const BasicBlock *, const BasicBlock *) const");
  }
  pIVar2 = BasicBlock::getHandler((BasicBlock *)i._M_node);
  if (pIVar2 == this) {
    local_38._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
         ::cbegin(&this->blocks_);
    local_40 = (_List_node_base *)
               std::__cxx11::
               list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
               ::cend(&this->blocks_);
    local_48 = &afterThat_local;
    local_30._M_node =
         (_List_node_base *)
         std::
         find_if<std::_List_const_iterator<std::unique_ptr<flow::BasicBlock,std::default_delete<flow::BasicBlock>>>,flow::IRHandler::isAfter(flow::BasicBlock_const*,flow::BasicBlock_const*)const::__0>
                   (local_38,(_List_const_iterator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>
                              )local_40,(anon_class_8_1_3fcf64fe_for__M_pred)local_48);
    local_50._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
         ::cend(&this->blocks_);
    bVar1 = std::operator==(&local_30,&local_50);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      std::
      _List_const_iterator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>
      ::operator++(&local_30);
      local_58._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
           ::cend(&this->blocks_);
      bVar1 = std::operator==(&local_30,&local_58);
      if (bVar1) {
        this_local._7_1_ = false;
      }
      else {
        this_00 = std::
                  _List_const_iterator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>
                  ::operator->(&local_30);
        pBVar3 = std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>::get
                           (this_00);
        this_local._7_1_ = pBVar3 == (pointer)i._M_node;
      }
    }
    return this_local._7_1_;
  }
  __assert_fail("afterThat->getHandler() == this",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/ir/IRHandler.cc"
                ,0x49,"bool flow::IRHandler::isAfter(const BasicBlock *, const BasicBlock *) const")
  ;
}

Assistant:

bool IRHandler::isAfter(const BasicBlock* bb, const BasicBlock* afterThat) const {
  assert(bb->getHandler() == this);
  assert(afterThat->getHandler() == this);

  auto i = std::find_if(blocks_.cbegin(), blocks_.cend(),
                       [&](const auto& obj) { return obj.get() == bb; });

  if (i == blocks_.cend())
    return false;

  ++i;

  if (i == blocks_.cend())
    return false;

  return i->get() == afterThat;
}